

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

vector<long_long,_std::allocator<long_long>_> *
hiberlite::Database::dbSelectChildIds
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,
          shared_connection *con,string *table,sqlid_t parent)

{
  longlong *val;
  allocator local_e2;
  allocator local_e1;
  shared_connection local_e0;
  sqlid_t local_d0;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  local_e0._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_e0.res = con->res;
  if (local_e0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_e0.res)->refCount = (local_e0.res)->refCount + 1;
  }
  local_d0 = parent;
  std::__cxx11::string::string((string *)&local_28,(string *)table);
  std::__cxx11::string::string((string *)&local_88,"hiberlite_parent_id",&local_e1);
  std::operator+(&local_68,&local_88,"=");
  Transformer::toSQLiteValue_abi_cxx11_(&local_a8,(Transformer *)&local_d0,val);
  std::operator+(&local_48,&local_68,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"hiberlite_entry_indx",&local_e2);
  dbSelectIds(__return_storage_ptr__,&local_e0,&local_28,&local_48,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_28);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<sqlid_t> Database::dbSelectChildIds(shared_connection con, std::string table, sqlid_t parent)
{
	return dbSelectIds(con, table, std::string(HIBERLITE_PARENTID_COLUMN)+"="+Transformer::toSQLiteValue(parent)
									, HIBERLITE_ENTRY_INDEX_COLUMN);
}